

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall particleSamples::read_in_particle_samples_JAM_mixed_event(particleSamples *this)

{
  ifstream *piVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_01;
  undefined4 uVar2;
  char cVar3;
  istream *piVar4;
  long lVar5;
  long lVar6;
  anon_struct_120_15_f999644b *paVar7;
  iterator __position_00;
  int iVar8;
  byte bVar9;
  char cdummy;
  int n_particle;
  int temp_monval;
  int event_id;
  string temp_string;
  particle_info temp_particle_info;
  stringstream temp2;
  stringstream temp1;
  char local_405;
  int local_404;
  int local_400;
  int local_3fc;
  uint local_3f8;
  int local_3f4;
  ios_base *local_3f0;
  ios_base *local_3e8;
  int local_3dc;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  anon_struct_120_15_f999644b local_3b8;
  vector<particle_info,_std::allocator<particle_info>_> *local_340 [16];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  bVar9 = 0;
  clear_out_previous_record(this,this->full_particle_list_mixed_event);
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  piVar1 = &this->inputfile_mixed_event;
  local_3e8 = local_2c0;
  local_3f0 = aiStack_138;
  local_404 = 0;
  local_400 = 0;
  do {
    if (this->event_buffer_size <= local_400) break;
    cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)piVar1,(string *)&local_3d8,cVar3);
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_3d8,_S_out|_S_in);
    piVar4 = std::operator>>((istream *)local_1b8,&local_405);
    piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3dc);
    std::istream::operator>>(piVar4,&local_3fc);
    local_3f8 = *(uint *)(&this->field_0x3f0 +
                         *(long *)(*(long *)&this->inputfile_mixed_event + -0x18));
    if ((local_3f8 & 2) == 0) {
      this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list_mixed_event;
      local_340[0] = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_00,__position,local_340);
      }
      else {
        *__position._M_current = local_340[0];
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      if (0 < local_3fc) {
        lVar6 = (long)local_404;
        iVar8 = 0;
        do {
          cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)piVar1,(string *)&local_3d8,cVar3);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_340,(string *)&local_3d8,_S_out|_S_in);
          std::istream::operator>>((istream *)local_340,&local_3f4);
          piVar4 = std::istream::_M_extract<double>((double *)local_340);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          piVar4 = std::istream::_M_extract<double>((double *)piVar4);
          std::istream::_M_extract<double>((double *)piVar4);
          local_3b8.E = SQRT(local_3b8.pz * local_3b8.pz +
                             local_3b8.py * local_3b8.py +
                             local_3b8.mass * local_3b8.mass + local_3b8.px * local_3b8.px);
          local_3b8.monval = local_3f4;
          this_01 = (vector<particle_info,std::allocator<particle_info>> *)
                    (this->full_particle_list_mixed_event->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar6];
          __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_01 + 8);
          if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_01 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(this_01,__position_00,&local_3b8);
          }
          else {
            paVar7 = &local_3b8;
            for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
              uVar2 = *(undefined4 *)&paVar7->field_0x4;
              (__position_00._M_current)->monval = paVar7->monval;
              *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar2;
              paVar7 = (anon_struct_120_15_f999644b *)((long)paVar7 + ((ulong)bVar9 * -2 + 1) * 8);
              __position_00._M_current = __position_00._M_current + (ulong)bVar9 * -0x10 + 8;
            }
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x78;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base(local_3e8);
          iVar8 = iVar8 + 1;
        } while (iVar8 < local_3fc);
      }
      local_400 = local_400 + local_3fc;
      local_404 = local_404 + 1;
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_3f0);
  } while ((local_3f8 & 2) == 0);
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_JAM_mixed_event() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int event_id, n_particle;
    char cdummy;
    int ievent = 0;
    int temp_monval;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile_mixed_event, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> cdummy >> event_id >> n_particle;

        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile_mixed_event, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> temp_monval;
            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.t;
            temp_particle_info.E = sqrt(
                temp_particle_info.mass * temp_particle_info.mass
                + temp_particle_info.px * temp_particle_info.px
                + temp_particle_info.py * temp_particle_info.py
                + temp_particle_info.pz * temp_particle_info.pz);
            temp_particle_info.monval = temp_monval;
            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}